

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadString
          (EpsCopyInputStream *this,char *ptr,int size,string *s)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = BytesAvailable(this,ptr);
  if (iVar1 < size) {
    pcVar2 = ReadStringFallback(this,ptr,size,s);
    return pcVar2;
  }
  std::__cxx11::string::resize((ulong)s,(char)size);
  memcpy((s->_M_dataplus)._M_p,ptr,(long)size);
  return ptr + size;
}

Assistant:

[[nodiscard]] const char* ReadString(const char* ptr, int size,
                                       std::string* s) {
    if (size <= BytesAvailable(ptr)) {
      // Fundamentally we just want to do assign to the string.
      // However micro-benchmarks regress on string reading cases. So we copy
      // the same logic from the old CodedInputStream ReadString. Note: as of
      // Apr 2021, this is still a significant win over `assign()`.
      absl::strings_internal::STLStringResizeUninitialized(s, size);
      char* z = &(*s)[0];
      memcpy(z, ptr, size);
      return ptr + size;
    }
    return ReadStringFallback(ptr, size, s);
  }